

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O2

void __thiscall UniValue::setNumStr(UniValue *this,string str)

{
  long lVar1;
  char *raw;
  jtokentype jVar2;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string tokenVal;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  tokenVal._M_dataplus._M_p = (pointer)&tokenVal.field_2;
  tokenVal._M_string_length = 0;
  tokenVal.field_2._M_local_buf[0] = '\0';
  raw = (in_RSI->_M_dataplus)._M_p;
  jVar2 = getJsonToken(&tokenVal,(uint *)&local_60,raw,raw + in_RSI->_M_string_length);
  std::__cxx11::string::~string((string *)&tokenVal);
  if (jVar2 == JTOK_NUMBER) {
    clear(this);
    this->typ = VNUM;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->val,in_RSI);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_60,"The string \'",in_RSI);
    std::operator+(&tokenVal,&local_60,"\' is not a valid JSON number");
    std::runtime_error::runtime_error(this_00,(string *)&tokenVal);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

void UniValue::setNumStr(std::string str)
{
    if (!validNumStr(str)) {
        throw std::runtime_error{"The string '" + str + "' is not a valid JSON number"};
    }

    clear();
    typ = VNUM;
    val = std::move(str);
}